

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_cmd_ln.c
# Opt level: O1

int parse_cmd_ln(int argc,char **argv)

{
  cmd_ln_t *pcVar1;
  long lVar2;
  long lVar3;
  char examplestr [135];
  char helpstr [347];
  undefined1 auStack_208 [144];
  undefined1 local_178 [352];
  
  memcpy(local_178,
         "Description: \n\nagg_seg accumulate feature vectors and use the accumulated values to quantize \nthe vector space.  This functionality is useful in semi-continuous training \ninitialization. Feature vectors are skipped according to the option -stride. \n\nSome options are specific to Sphinx-2.\nPlease type -example yes to get an example argument list."
         ,0x15b);
  memcpy(auStack_208,
         "Example: \n\nagg_seg -segdmpdirs segdmpdir -segdmpfn dumpfile -segtype all -ctlfn \nctl -cepdir cepdir -cepext mfc -ceplen 13 -stride 10 "
         ,0x87);
  cmd_ln_parse(parse_cmd_ln::defn,argc,argv,1);
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-help");
  pcVar1 = cmd_ln_get();
  lVar3 = cmd_ln_int_r(pcVar1,"-example");
  if ((int)lVar2 != 0) {
    printf("%s\n\n",local_178);
  }
  if ((int)lVar3 != 0) {
    printf("%s\n\n",auStack_208);
  }
  if ((int)lVar3 == 0 && (int)lVar2 == 0) {
    return 0;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/agg_seg/parse_cmd_ln.c"
          ,0xd3,"User asked for help or example.\n");
  exit(0);
}

Assistant:

int
parse_cmd_ln(int argc, char *argv[])
{
  uint32      isHelp;
  uint32      isExample;

    const char helpstr[] =  
"Description: \n\
\n\
agg_seg accumulate feature vectors and use the accumulated values to quantize \n\
the vector space.  This functionality is useful in semi-continuous training \n\
initialization. Feature vectors are skipped according to the option -stride. \n\
\n\
Some options are specific to Sphinx-2.\n\
Please type -example yes to get an example argument list.";

    const char examplestr[]=
"Example: \n\
\n\
agg_seg -segdmpdirs segdmpdir -segdmpfn dumpfile -segtype all -ctlfn \n\
ctl -cepdir cepdir -cepext mfc -ceplen 13 -stride 10 ";


    static arg_t defn[] = {
	{ "-help",
	  ARG_BOOLEAN,
	  "no",
	  "Shows the usage of the tool"},

	{ "-example",
	  ARG_BOOLEAN,
	  "no",
	  "Shows example of how to use the tool"},

	{ "-segdmpdirs",
	  ARG_STRING_LIST,
	  NULL,
	  "Segment dump directories" },
	{ "-segdmpfn",
	  ARG_STRING,
	  NULL,
	  "Segment dump file" },
	{ "-segidxfn",
	  ARG_STRING,
	  NULL,
	  "Segment index into the dump file." },
	{ "-segtype",
	  ARG_STRING,
	  "st",
	  "Type of segments to dump.  {all,st,phn}" },

	{ "-cntfn",
	  ARG_STRING,
	  NULL,
	  "Per id count file" },

	{ "-lsnfn",
	  ARG_STRING,
	  NULL,
	  "Lexical transcript file (contains all utts in ctl file)" },
	{ "-sentdir",
	  ARG_STRING,
	  NULL,
	  "Root directory of sent (lexical transcript) files" },
	{ "-sentext",
	  ARG_STRING,
	  NULL,
	  "Extension of sent (lexical transcript) files" },
	{ "-ctlfn",
	  ARG_STRING,
	  NULL,
	  "The control file name (enumerates utts in corpus)" },
	{ "-mllrctlfn",
	  ARG_STRING,
	  NULL,
	  "Lists the MLLR transforms for each utterance" },
	{ "-mllrdir",
	  ARG_STRING,
	  NULL,
	  "Directory for MLLR matrices" },
	{ "-nskip",
	  ARG_INT32,
	  "0",
	  "The number of utterances to skip in the control file"},
	{ "-runlen",
	  ARG_INT32,
	  "-1",
	  "The number of utterances to process after skipping"},
	{ "-moddeffn",
	  ARG_STRING,
	  NULL,
	  "Model definition file containing all the triphones in the corpus.  State/transition matrix definitions are ignored." },
	{ "-ts2cbfn",
	  ARG_STRING,
	  NULL,
	  "Tied state to codebook mapping file (may be '.semi.' or '.cont.')"},
	{ "-cb2mllrfn",
	  ARG_STRING,
	  ".1cls.",
	  "codebook to MLLR class mapping file (may be '.1cls.')"},
	{ "-dictfn",
	  ARG_STRING,
	  NULL,
	  "Dictionary containing pronunciations for the words."},
	{ "-fdictfn",
	  ARG_STRING,
	  NULL,
	  "Dictionary containing pronunciations for the fillers."},

	{ "-segdir",
	  ARG_STRING,
	  NULL,
	  "Root directory of the state segmentation files"},
	{ "-segext",
	  ARG_STRING,
	  "v8_seg",
	  "Extension of the state segmentation files"},

	{ "-cepdir",
	  ARG_STRING,
	  NULL,
	  "Root directory of the cepstrum files"},
	{ "-cepext",
	  ARG_STRING,
	  "mfc",
	  "Extension of the cepstrum files"},
	{ "-cachesz",
	  ARG_INT32,
	  "200",
	  "Feature cache size in Mb"},

	{ "-stride",
	  ARG_INT32,
	  "1",
	  "Take every -stride'th frame when producing dmp" },

	{ "-part",
	  ARG_INT32,
	  NULL,
	  "Identifies the corpus part number (range 1..NPART)" },

	{ "-npart",
	  ARG_INT32,
	  NULL,
	  "Partition the corpus into this many equal sized subsets" },


	cepstral_to_feature_command_line_macro(),
	{NULL, 0, NULL, NULL}
    };

    cmd_ln_parse(defn, argc, argv, TRUE);

    isHelp    = cmd_ln_int32("-help");
    isExample    = cmd_ln_int32("-example");

    if(isHelp){
      printf("%s\n\n",helpstr);
    }

    if(isExample){
      printf("%s\n\n",examplestr);
    }

    if(isHelp || isExample){
      E_INFO("User asked for help or example.\n");
      exit(0);
    }

    return 0;
}